

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::TransformPromiseNodeBase::getDepResult
          (TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  undefined8 this_00;
  PromiseNode *pPVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  anon_class_8_1_8991fb9c *func;
  Exception *e;
  Exception *_e2502;
  Exception *exception;
  undefined1 local_350 [416];
  undefined1 local_1b0 [8];
  NullableValue<kj::Exception> _exception2498;
  ExceptionOrValue *output_local;
  TransformPromiseNodeBase *this_local;
  
  _exception2498.field_1.value.details.builder.disposer = (ArrayDisposer *)output;
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->dependency);
  (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])
            (pPVar1,_exception2498.field_1.value.details.builder.disposer);
  local_350._0_8_ = this;
  runCatchingExceptions<kj::_::TransformPromiseNodeBase::getDepResult(kj::_::ExceptionOrValue&)::__0>
            ((Maybe<kj::Exception> *)(local_350 + 8),(kj *)local_350,func);
  other = readMaybe<kj::Exception>((Maybe<kj::Exception> *)(local_350 + 8));
  NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1b0,other);
  Maybe<kj::Exception>::~Maybe((Maybe<kj::Exception> *)(local_350 + 8));
  pEVar2 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1b0);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_1b0);
    this_00 = _exception2498.field_1.value.details.builder.disposer;
    pEVar2 = mv<kj::Exception>(pEVar2);
    ExceptionOrValue::addException((ExceptionOrValue *)this_00,pEVar2);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1b0);
  pEVar2 = readMaybe<kj::Exception>
                     ((Maybe<kj::Exception> *)_exception2498.field_1.value.details.builder.disposer)
  ;
  if (pEVar2 != (Exception *)0x0) {
    Exception::addTrace(pEVar2,this->continuationTracePtr);
  }
  return;
}

Assistant:

void TransformPromiseNodeBase::getDepResult(ExceptionOrValue& output) {
  dependency->get(output);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    dependency = nullptr;
  })) {
    output.addException(kj::mv(exception));
  }

  KJ_IF_SOME(e, output.exception) {
    e.addTrace(continuationTracePtr);
  }
}